

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshCheckTest(void)

{
  uint uVar1;
  uint uVar2;
  int Chow0_00;
  uint local_a4;
  ulong uStack_a0;
  int i;
  word t;
  int Weights [16];
  int Chow [16];
  int Chow0;
  int T;
  int nVars;
  
  uStack_a0 = s_Truths6[0] & s_Truths6[1] & s_Truths6[2] |
              s_Truths6[0] & s_Truths6[1] & s_Truths6[3] |
              s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5] |
              s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5];
  for (local_a4 = 0; (int)local_a4 < 6; local_a4 = local_a4 + 1) {
    uVar1 = Abc_TtPosVar(&stack0xffffffffffffff60,6,local_a4);
    uVar2 = Abc_TtNegVar(&stack0xffffffffffffff60,6,local_a4);
    printf("%d %d %d\n",(ulong)local_a4,(ulong)uVar1,(ulong)uVar2);
  }
  Extra_ThreshComputeChow(&stack0xffffffffffffff60,6,Weights + 0xe);
  Chow0_00 = Extra_ThreshCheck(&stack0xffffffffffffff60,6,(int *)&t);
  if (Chow0_00 == 0) {
    printf("No threshold\n");
  }
  else {
    Extra_ThreshPrintChow(Chow0_00,(int *)&t,6);
  }
  return;
}

Assistant:

void Extra_ThreshCheckTest() {
    int nVars = 6;
    int T, Chow0, Chow[16], Weights[16];
//    word t =  s_Truths6[0] & s_Truths6[1] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4];
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[4]);
//    word t = (s_Truths6[2] & s_Truths6[1])
//            | (s_Truths6[2] & s_Truths6[0] & s_Truths6[3])
//            | (s_Truths6[2] & s_Truths6[0] & ~s_Truths6[4]);
    word t = (s_Truths6[0] & s_Truths6[1] & s_Truths6[2])| (s_Truths6[0] & s_Truths6[1] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]);
//    word t =  (s_Truths6[0] & s_Truths6[1]) | (s_Truths6[0] & s_Truths6[2]) | (s_Truths6[0] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]) | 
//        (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[4]) | (s_Truths6[1] & s_Truths6[2] & s_Truths6[5]);
    int i;
    assert(nVars <= 8);
    for (i = 0; i < nVars; i++)
        printf("%d %d %d\n", i, Abc_TtPosVar(&t, nVars, i),
                Abc_TtNegVar(&t, nVars, i));
//    word t = s_Truths6[0] & s_Truths6[1] & s_Truths6[2];
    Chow0 = Extra_ThreshComputeChow(&t, nVars, Chow);
    if ((T = Extra_ThreshCheck(&t, nVars, Weights)))
        Extra_ThreshPrintChow(T, Weights, nVars);
    else
        printf("No threshold\n");
}